

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O3

bool sb_bmp_is_writable(filemgr *file,bid_t bid)

{
  __int_type _Var1;
  superblock *psVar2;
  __pointer_type puVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  
  bVar4 = true;
  if (file->sb->config->num_sb <= bid) {
    uVar5 = (file->last_commit).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
    _Var1 = (file->last_writable_bmp_revnum).super___atomic_base<unsigned_long>._M_i;
    psVar2 = file->sb;
    LOCK();
    (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i =
         (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    if ((psVar2->bmp_wcount).super___atomic_base<unsigned_long>._M_i != 0) {
      LOCK();
      (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i =
           (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      pthread_spin_lock(&psVar2->bmp_lock);
      LOCK();
      (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i =
           (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      pthread_spin_unlock(&psVar2->bmp_lock);
    }
    puVar3 = (psVar2->bmp)._M_b._M_p;
    uVar6 = (uint)bid;
    if ((psVar2->bmp_revnum).super___atomic_base<unsigned_long>._M_i == _Var1) {
      if (bid < (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i) {
        if ((puVar3[bid >> 3] & bmp_basic_mask[uVar6 & 7]) == 0) {
          bVar4 = false;
        }
        else {
          bVar4 = uVar5 <= bid &&
                  bid < (psVar2->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i;
        }
      }
      else {
        bVar4 = uVar5 <= bid;
      }
    }
    else {
      if (bid < uVar5) {
        bVar4 = false;
      }
      else if (psVar2->bmp_prev == (uint8_t *)0x0) {
        bVar4 = true;
      }
      else {
        if (bid < psVar2->bmp_prev_size) {
          bVar4 = (psVar2->bmp_prev[bid >> 3] & bmp_basic_mask[uVar6 & 7]) != 0;
        }
        else {
          bVar4 = false;
        }
        if (bid < (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i) {
          bVar4 = (bool)((puVar3[bid >> 3] & bmp_basic_mask[uVar6 & 7]) != 0 | bVar4);
        }
        bVar4 = (bool)((psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i <= bid | bVar4);
      }
      if ((bid < (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i) &&
         (bid < (psVar2->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i)) {
        bVar4 = (bool)((puVar3[bid >> 3] & bmp_basic_mask[uVar6 & 7]) != 0 | bVar4);
      }
    }
    LOCK();
    (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i =
         (psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
  }
  return bVar4;
}

Assistant:

bool sb_bmp_is_writable(struct filemgr *file, bid_t bid)
{
    if (bid < file->sb->config->num_sb) {
        // superblocks are always writable
        return true;
    }

    bool ret = false;
    bid_t last_commit = atomic_get_uint64_t(&file->last_commit) / file->blocksize;
    uint64_t lw_bmp_revnum = atomic_get_uint64_t(&file->last_writable_bmp_revnum);
    struct superblock *sb = file->sb;

    sb_bmp_barrier_on(sb);

    uint8_t *sb_bmp = sb->bmp;
    if (atomic_get_uint64_t(&sb->bmp_revnum) == lw_bmp_revnum) {
        // Same bitmap revision number: there are 2 possible cases
        //
        // (1) normal case
        //               writable blocks
        //            <---->          <--->
        // +-------------------------------------------+
        // |       xxxxxxxxx          xxxxxxxxxx       | (x: reused blocks)
        // +-------------------------------------------+
        //            ^                   ^
        //            last_commit         cur_alloc
        //
        // (2) when file size grows after block reusing
        //                                   writable blocks
        //                             <------->       <--------->
        // +-------------------------------------------+---------+
        // |       xxxxxxxxx          xxxxxxxxxx       |         |
        // +-------------------------------------------+---------+
        //                             ^               ^         ^
        //                             last_commit     bmp_size  cur_alloc

        if (bid < atomic_get_uint64_t(&sb->bmp_size)) {
            // BID is in the bitmap .. check if bitmap is set.
            if (_is_bmp_set(sb_bmp, bid) &&
                bid < atomic_get_uint64_t(&sb->cur_alloc_bid) &&
                bid >= last_commit) {
                ret = true;
            }
        } else {
            // BID is out-of-range of the bitmap
            if (bid >= last_commit) {
                ret = true;
            }
        }
    } else {
        // Different bitmap revision number: there are also 2 possible cases
        //
        // (1) normal case
        //     writable blocks                 writable blocks
        //         <---->                          <--->
        // +-------------------------------------------+
        // |       xxxxxxxxx          xxxxxxxxxx       |
        // +-------------------------------------------+
        //              ^                          ^
        //              cur_alloc                  last_commit
        //
        // (2) when file size grows after block reusing
        //         writable blocks             writable blocks
        //      <---->       <------>      <-----------x--------->
        // +-------------------------------------------+---------+
        // |    xxxxxx       xxxxxxxx                  |         |
        // +-------------------------------------------+---------+
        //                                 ^           ^         ^
        //                                 last_commit bmp_size  cur_alloc

        // the block is writable if
        // 1) BID >= last_commit OR
        // 2) BID < cur_alloc_bid AND corresponding bitmap is set.
        if (bid >= last_commit) {
            // if prev_bmp exists, last commit position is still located on the
            // previous bitmap (since prev_bmp is released when a commit is invoked
            // in the new bitmap).
            // So in this case, we have to check both previous/current bitmaps.
            //
            // (1: previous bitmap (sb->bmp_prev), 2: current bitmap (sb->bmp))
            //
            //        writable blocks          writable blocks
            //    <-->      <---->   <-->          <> <> <>
            // +-------------------------------------------+
            // |  2222 1111 222222   2222   111111111 22 11|
            // +-------------------------------------------+
            //                                     ^
            //                                     last_commit
            if (sb->bmp_prev) {
                if (bid < sb->bmp_prev_size &&
                    _is_bmp_set(sb->bmp_prev, bid)) {
                    ret = true;
                }
                if (bid < atomic_get_uint64_t(&sb->bmp_size) &&
                    _is_bmp_set(sb_bmp, bid)) {
                    ret = true;
                }
                if (bid >= atomic_get_uint64_t(&sb->bmp_size)) {
                    // blocks newly allocated beyond the bitmap size:
                    // always writable
                    ret = true;
                }
            } else {
                // bmp_prev doesn't exist even though bmp_revnum is different
                // this happens on the first block reclaim only
                // so all blocks whose 'BID >= last_commit' are writable.
                ret = true;
            }
        }

        if (bid < atomic_get_uint64_t(&sb->bmp_size) &&
            bid < atomic_get_uint64_t(&sb->cur_alloc_bid) &&
            _is_bmp_set(sb_bmp, bid)) {
            // 'cur_alloc_bid' is always smaller than 'bmp_size'
            // except for the case 'cur_alloc_bid == BLK_NOT_FOUND'
            ret = true;
        }
    }

    sb_bmp_barrier_off(sb);

    return ret;
}